

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

Arena * tcmalloc::LowLevelAlloc::DefaultArena(void)

{
  if (DefaultArena::arena == (Arena *)0x0) {
    Arena::Arena((Arena *)&default_arena_storage);
    DefaultArena::arena = (Arena *)&default_arena_storage;
  }
  return DefaultArena::arena;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::DefaultArena() {
  static Arena* arena;
  if (!arena) {
    // Note, we expect this to happen early enough in process
    // lifetime, so we can afford to do without memory barriers.
    arena = default_arena_storage.Construct();
  }
  return arena;
}